

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall
bsplib::Rdma::put(Rdma *this,void *src,int dst_pid,Memslot dst_slot,size_t dst_offset,size_t size)

{
  size_t sVar1;
  Memblock *pMVar2;
  size_t sVar3;
  int __flags;
  size_t t_b;
  size_t t_a;
  TicToc t;
  size_t size_local;
  size_t dst_offset_local;
  Memslot dst_slot_local;
  int dst_pid_local;
  void *src_local;
  Rdma *this_local;
  
  __flags = (int)dst_offset;
  t.m_nbytes = size;
  TicToc::TicToc((TicToc *)&t_a,PUT,0);
  sVar1 = A2A::send_size(&this->m_second_exchange,dst_pid);
  pMVar2 = slot(this,this->m_pid,dst_slot);
  if ((pMVar2->status & 1) != 0) {
    __assert_fail("! (slot( m_pid, dst_slot ).status & Memblock::PUSHED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                  ,0x50,"void bsplib::Rdma::put(const void *, int, Memslot, size_t, size_t)");
  }
  serial<unsigned_long>(&this->m_second_exchange,dst_pid,t.m_nbytes);
  serial<unsigned_long>(&this->m_second_exchange,dst_pid,dst_slot);
  serial<unsigned_long>(&this->m_second_exchange,dst_pid,dst_offset);
  A2A::send(&this->m_second_exchange,dst_pid,src,t.m_nbytes,__flags);
  sVar3 = A2A::send_size(&this->m_second_exchange,dst_pid);
  TicToc::add_bytes((TicToc *)&t_a,sVar3 - sVar1);
  TicToc::~TicToc((TicToc *)&t_a);
  return;
}

Assistant:

void Rdma::put( const void * src,
        int dst_pid, Memslot dst_slot, size_t dst_offset, size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::PUT );
    size_t t_a = m_second_exchange.send_size(dst_pid);
#endif

    assert( ! (slot( m_pid, dst_slot ).status & Memblock::PUSHED) );

    serial( m_second_exchange, dst_pid, size );
    serial( m_second_exchange, dst_pid, dst_slot );
    serial( m_second_exchange, dst_pid, dst_offset );

    m_second_exchange.send( dst_pid, src, size );
#ifdef PROFILE
    size_t t_b = m_second_exchange.send_size(dst_pid);
    t.add_bytes(t_b-t_a);
#endif
}